

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

QAbstractItemView * __thiscall QCompleter::popup(QCompleter *this)

{
  long lVar1;
  QAbstractItemView *pQVar2;
  QAbstractItemView *this_00;
  
  lVar1 = *(long *)&this->field_0x8;
  pQVar2 = *(QAbstractItemView **)(lVar1 + 0x90);
  if (pQVar2 == (QAbstractItemView *)0x0) {
    if (*(int *)(lVar1 + 0x98) == 2) {
      pQVar2 = (QAbstractItemView *)0x0;
    }
    else {
      this_00 = (QAbstractItemView *)operator_new(0x28);
      QListView::QListView((QListView *)this_00,(QWidget *)0x0);
      QAbstractItemView::setEditTriggers(this_00,(EditTriggers)0x0);
      QAbstractScrollArea::setHorizontalScrollBarPolicy
                ((QAbstractScrollArea *)this_00,ScrollBarAlwaysOff);
      QAbstractItemView::setSelectionBehavior(this_00,SelectRows);
      QAbstractItemView::setSelectionMode(this_00,SingleSelection);
      QListView::setModelColumn((QListView *)this_00,*(int *)(lVar1 + 0xc0));
      setPopup(this,(QAbstractItemView *)this_00);
      pQVar2 = *(QAbstractItemView **)(lVar1 + 0x90);
    }
  }
  return pQVar2;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }